

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

int __thiscall CDemoPlayer::ReadChunkHeader(CDemoPlayer *this,int *pType,int *pSize,int *pTick)

{
  long lVar1;
  uint uVar2;
  uint *in_RDX;
  undefined4 *in_RSI;
  long in_FS_OFFSET;
  int Tickdelta;
  uchar Chunk;
  uchar aSizeData_1 [2];
  uchar aSizeData [1];
  uchar aTickData [4];
  void *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_14;
  ushort local_f;
  byte local_d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDX = 0;
  *in_RSI = 0;
  uVar2 = io_read((IOHANDLE)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffa8,0);
  if (uVar2 == 1) {
    *in_RSI = 0;
    *in_RDX = 0;
    if (*in_RDX == 0x1e) {
      uVar2 = io_read((IOHANDLE)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8,0);
      if (uVar2 != 1) {
        local_14 = -1;
        goto LAB_001490e4;
      }
      *in_RDX = (uint)local_d;
    }
    else if (*in_RDX == 0x1f) {
      uVar2 = io_read((IOHANDLE)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8,0);
      if (uVar2 != 2) {
        local_14 = -1;
        goto LAB_001490e4;
      }
      *in_RDX = (uint)local_f;
    }
    local_14 = 0;
  }
  else {
    local_14 = -1;
  }
LAB_001490e4:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

int CDemoPlayer::ReadChunkHeader(int *pType, int *pSize, int *pTick)
{
	unsigned char Chunk = 0;

	*pSize = 0;
	*pType = 0;

	if(io_read(m_File, &Chunk, sizeof(Chunk)) != sizeof(Chunk))
		return -1;

	if(Chunk&CHUNKTYPEFLAG_TICKMARKER)
	{
		// decode tick marker
		int Tickdelta = Chunk&(CHUNKMASK_TICK);
		*pType = Chunk&(CHUNKTYPEFLAG_TICKMARKER|CHUNKTICKFLAG_KEYFRAME);

		if(Tickdelta == 0)
		{
			unsigned char aTickData[4];
			if(io_read(m_File, aTickData, sizeof(aTickData)) != sizeof(aTickData))
				return -1;
			*pTick = bytes_be_to_int(aTickData);
		}
		else
		{
			*pTick += Tickdelta;
		}
	}
	else
	{
		// decode normal chunk
		*pType = (Chunk&CHUNKMASK_TYPE)>>5;
		*pSize = Chunk&CHUNKMASK_SIZE;

		if(*pSize == 30)
		{
			unsigned char aSizeData[1];
			if(io_read(m_File, aSizeData, sizeof(aSizeData)) != sizeof(aSizeData))
				return -1;
			*pSize = aSizeData[0];
		}
		else if(*pSize == 31)
		{
			unsigned char aSizeData[2];
			if(io_read(m_File, aSizeData, sizeof(aSizeData)) != sizeof(aSizeData))
				return -1;
			*pSize = (aSizeData[1]<<8) | aSizeData[0];
		}
	}

	return 0;
}